

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x_connective.c
# Opt level: O1

void value_release(t_symbol *s)

{
  t_pd *pp_Var1;
  t_pd *x;
  
  x = pd_findbyclass(s,vcommon_class);
  if (x == (t_pd *)0x0) {
    bug("value_release");
    return;
  }
  pp_Var1 = x + 1;
  *(int *)pp_Var1 = *(int *)pp_Var1 + -1;
  if (*(int *)pp_Var1 != 0) {
    return;
  }
  pd_unbind(x,s);
  pd_free(x);
  return;
}

Assistant:

void value_release(t_symbol *s)
{
    t_vcommon *c = (t_vcommon *)pd_findbyclass(s, vcommon_class);
    if (c)
    {
        if (!--c->c_refcount)
        {
            pd_unbind(&c->c_pd, s);
            pd_free(&c->c_pd);
        }
    }
    else bug("value_release");
}